

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

void Cmd_cmdlist(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pattern;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pattern_00;
  int count;
  long lVar5;
  char matcher [16];
  char acStack_48 [24];
  
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 == 1) {
    pattern = (char *)0x0;
  }
  else {
    pattern = FCommandLine::operator[](argv,1);
  }
  lVar5 = 0xc;
  iVar3 = 0;
  do {
    pcVar1 = ActionMaps[0].Name + lVar5 + -0xc;
    if (pattern == (char *)0x0) {
      Printf("+%s\n",pcVar1);
      iVar3 = iVar3 + 1;
LAB_0035b874:
      Printf("-%s\n",pcVar1);
      iVar3 = iVar3 + 1;
      pattern_00 = extraout_RDX_00;
    }
    else {
      mysnprintf(acStack_48,0x10,"+%s",pcVar1);
      bVar2 = CheckWildcards(pattern,acStack_48);
      if (bVar2) {
        Printf("+%s\n",pcVar1);
        iVar3 = iVar3 + 1;
      }
      mysnprintf(acStack_48,0x10,"-%s",pcVar1);
      bVar2 = CheckWildcards(pattern,acStack_48);
      pattern_00 = extraout_RDX;
      if (bVar2) goto LAB_0035b874;
    }
    lVar5 = lVar5 + 0x18;
    if (lVar5 == 0x30c) {
      iVar4 = DumpHash((FConsoleCommand **)0x0,SUB81(pattern,0),pattern_00);
      Printf("%d commands\n",(ulong)(uint)(iVar3 + iVar4));
      return;
    }
  } while( true );
}

Assistant:

CCMD (cmdlist)
{
	int count;
	const char *filter = (argv.argc() == 1 ? NULL : argv[1]);

	count = ListActionCommands (filter);
	count += DumpHash (Commands, false, filter);
	Printf ("%d commands\n", count);
}